

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::interecursive
          (tetgenmesh *this,shellface **subfacearray,int arraysize,int axis,double bxmin,
          double bxmax,double bymin,double bymax,double bzmin,double bzmax,int *internum)

{
  ulong uVar1;
  uint *puVar2;
  shellface *pppdVar3;
  shellface A;
  shellface B;
  shellface C;
  shellface *pppdVar4;
  shellface O;
  shellface P;
  shellface Q;
  shellface **subfacearray_00;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  shellface ppdVar12;
  double local_a0;
  double local_98;
  ulong local_88;
  shellface **local_70;
  shellface **local_68;
  undefined4 uVar13;
  
  local_a0 = bymin;
  local_98 = bzmin;
LAB_0012ac2d:
LAB_0012ac3d:
  uVar7 = arraysize;
  local_68 = subfacearray;
  do {
    uVar9 = (ulong)uVar7;
    if (2 < this->b->verbose) {
      pcVar6 = "z";
      if (axis == 1) {
        pcVar6 = "y";
      }
      if (axis == 0) {
        pcVar6 = "x";
      }
      printf("      Recur %d faces. Bbox (%g, %g, %g),(%g, %g, %g). %s-axis\n",bxmin,local_a0,
             local_98,bxmax,bymax,bzmax,uVar9,pcVar6);
    }
    uVar8 = uVar9 * 8;
    if ((int)uVar7 < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    subfacearray_00 = (shellface **)operator_new__(uVar8);
    subfacearray = (shellface **)operator_new__(uVar8);
    dVar11 = bxmin + bxmax;
    if ((axis != 0) && (dVar11 = local_a0 + bymax, axis != 1)) {
      dVar11 = local_98 + bzmax;
    }
    dVar11 = dVar11 * 0.5;
    iVar10 = 0;
    arraysize = 0;
    if (0 < (int)uVar7) {
      uVar8 = 0;
      iVar10 = 0;
      do {
        pppdVar3 = local_68[uVar8];
        if (dVar11 <= (double)pppdVar3[3][axis]) {
          if ((((double)pppdVar3[3][axis] <= dVar11) || ((double)pppdVar3[4][axis] <= dVar11)) ||
             ((double)pppdVar3[5][axis] <= dVar11)) goto LAB_0012ad96;
LAB_0012ada0:
          subfacearray[arraysize] = pppdVar3;
          arraysize = arraysize + 1;
        }
        else {
          if ((dVar11 <= (double)pppdVar3[4][axis]) || (dVar11 <= (double)pppdVar3[5][axis])) {
LAB_0012ad96:
            subfacearray_00[iVar10] = pppdVar3;
            iVar10 = iVar10 + 1;
            goto LAB_0012ada0;
          }
          subfacearray_00[iVar10] = pppdVar3;
          iVar10 = iVar10 + 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    if (((int)uVar7 <= iVar10) || ((int)uVar7 <= arraysize)) {
      if (1 < this->b->verbose) {
        puts("  Checking intersecting faces.");
      }
      if (0 < (int)uVar7) {
        local_70 = local_68;
        uVar8 = 0;
        local_88 = uVar9;
        do {
          uVar1 = uVar8 + 1;
          if (uVar1 < uVar9) {
            pppdVar3 = local_68[uVar8];
            A = pppdVar3[3];
            B = pppdVar3[4];
            C = pppdVar3[5];
            uVar8 = 1;
            do {
              pppdVar4 = local_70[uVar8];
              O = pppdVar4[3];
              P = pppdVar4[4];
              Q = pppdVar4[5];
              ppdVar12 = Q;
              iVar10 = tri_tri_inter(this,(double *)A,(double *)B,(double *)C,(double *)O,
                                     (double *)P,(double *)Q);
              uVar13 = (undefined4)((ulong)ppdVar12 >> 0x20);
              if ((iVar10 == 4) || (iVar10 == 1)) {
                if (this->b->quiet == 0) {
                  pcVar6 = "  Facet #%d intersects facet #%d at triangles:\n";
                  if (iVar10 != 1) {
                    pcVar6 = "  Facet #%d duplicates facet #%d at triangle:\n";
                  }
                  printf(pcVar6,(ulong)*(uint *)((long)pppdVar3 + (long)this->shmarkindex * 4),
                         (ulong)*(uint *)((long)pppdVar4 + (long)this->shmarkindex * 4));
                  lVar5 = (long)this->pointmarkindex;
                  printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                         (ulong)*(uint *)((long)A + lVar5 * 4),(ulong)*(uint *)((long)B + lVar5 * 4)
                         ,(ulong)*(uint *)((long)C + lVar5 * 4),
                         (ulong)*(uint *)((long)O + lVar5 * 4),(ulong)*(uint *)((long)P + lVar5 * 4)
                         ,CONCAT44(uVar13,*(undefined4 *)((long)Q + lVar5 * 4)));
                }
                *internum = *internum + 1;
                puVar2 = (uint *)((long)pppdVar3 + (long)this->shmarkindex * 4 + 4);
                *puVar2 = *puVar2 | 1;
                puVar2 = (uint *)((long)pppdVar4 + (long)this->shmarkindex * 4 + 4);
                *puVar2 = *puVar2 | 1;
              }
              uVar8 = uVar8 + 1;
            } while (local_88 != uVar8);
          }
          local_70 = local_70 + 1;
          local_88 = local_88 - 1;
          uVar8 = uVar1;
        } while (uVar1 != uVar9);
      }
      operator_delete__(subfacearray_00);
      operator_delete__(subfacearray);
      if (local_68 != (shellface **)0x0) {
        operator_delete__(local_68);
        return;
      }
      return;
    }
    if (local_68 != (shellface **)0x0) {
      operator_delete__(local_68);
    }
    if (axis == 0) {
      axis = 1;
      interecursive(this,subfacearray_00,iVar10,1,bxmin,dVar11,local_a0,bymax,local_98,bzmax,
                    internum);
      bxmin = dVar11;
      goto LAB_0012ac2d;
    }
    if (axis == 1) break;
    axis = 0;
    interecursive(this,subfacearray_00,iVar10,0,bxmin,bxmax,local_a0,bymax,local_98,dVar11,internum)
    ;
    uVar7 = arraysize;
    local_98 = dVar11;
    local_68 = subfacearray;
  } while( true );
  axis = 2;
  interecursive(this,subfacearray_00,iVar10,2,bxmin,bxmax,local_a0,dVar11,local_98,bzmax,internum);
  local_a0 = dVar11;
  goto LAB_0012ac3d;
}

Assistant:

void tetgenmesh::interecursive(shellface** subfacearray, int arraysize, 
                               int axis, REAL bxmin, REAL bxmax, REAL bymin, 
                               REAL bymax, REAL bzmin, REAL bzmax, 
                               int* internum)
{
  shellface **leftarray, **rightarray;
  face sface1, sface2;
  point p1, p2, p3;
  point p4, p5, p6;
  enum interresult intersect;
  REAL split;
  bool toleft, toright;
  int leftsize, rightsize;
  int i, j;

  if (b->verbose > 2) {
    printf("      Recur %d faces. Bbox (%g, %g, %g),(%g, %g, %g). %s-axis\n",
           arraysize, bxmin, bymin, bzmin, bxmax, bymax, bzmax,
           axis == 0 ? "x" : (axis == 1 ? "y" : "z"));
  }
    
  leftarray = new shellface*[arraysize];
  if (leftarray == NULL) {
    terminatetetgen(this, 1);
  }
  rightarray = new shellface*[arraysize];
  if (rightarray == NULL) {
    terminatetetgen(this, 1);
  }
  leftsize = rightsize = 0;

  if (axis == 0) {
    // Split along x-axis.
    split = 0.5 * (bxmin + bxmax);
  } else if (axis == 1) {
    // Split along y-axis.
    split = 0.5 * (bymin + bymax);
  } else {
    // Split along z-axis.
    split = 0.5 * (bzmin + bzmax);
  }

  for (i = 0; i < arraysize; i++) {
    sface1.sh = subfacearray[i];
    p1 = (point) sface1.sh[3];
    p2 = (point) sface1.sh[4];
    p3 = (point) sface1.sh[5];
    toleft = toright = false;
    if (p1[axis] < split) {
      toleft = true;
      if (p2[axis] >= split || p3[axis] >= split) {
        toright = true;
      } 
    } else if (p1[axis] > split) {
      toright = true;
      if (p2[axis] <= split || p3[axis] <= split) {
        toleft = true;
      } 
    } else {
      // p1[axis] == split;
      toleft = true;
      toright = true;
    }
    if (toleft) {
      leftarray[leftsize] = sface1.sh;
      leftsize++;
    }
    if (toright) {
      rightarray[rightsize] = sface1.sh;
      rightsize++;
    }
  }

  if (leftsize < arraysize && rightsize < arraysize) {
    // Continue to partition the input set. Now 'subfacearray' has been
    //   split into two sets, it's memory can be freed. 'leftarray' and
    //   'rightarray' will be freed in the next recursive (after they're
    //   partitioned again or performing tests).
    delete [] subfacearray;
    // Continue to split these two sets.
    if (axis == 0) {
      interecursive(leftarray, leftsize, 1, bxmin, split, bymin, bymax,
                    bzmin, bzmax, internum);
      interecursive(rightarray, rightsize, 1, split, bxmax, bymin, bymax,
                    bzmin, bzmax, internum);
    } else if (axis == 1) {
      interecursive(leftarray, leftsize, 2, bxmin, bxmax, bymin, split,
                    bzmin, bzmax, internum);
      interecursive(rightarray, rightsize, 2, bxmin, bxmax, split, bymax,
                    bzmin, bzmax, internum);
    } else {
      interecursive(leftarray, leftsize, 0, bxmin, bxmax, bymin, bymax,
                    bzmin, split, internum);
      interecursive(rightarray, rightsize, 0, bxmin, bxmax, bymin, bymax,
                    split, bzmax, internum);
    }
  } else {
    if (b->verbose > 1) {
      printf("  Checking intersecting faces.\n");
    }
    // Perform a brute-force compare on the set.
    for (i = 0; i < arraysize; i++) {
      sface1.sh = subfacearray[i];
      p1 = (point) sface1.sh[3];
      p2 = (point) sface1.sh[4];
      p3 = (point) sface1.sh[5];
      for (j = i + 1; j < arraysize; j++) {
        sface2.sh = subfacearray[j];
        p4 = (point) sface2.sh[3];
        p5 = (point) sface2.sh[4];
        p6 = (point) sface2.sh[5];
        intersect = (enum interresult) tri_tri_inter(p1, p2, p3, p4, p5, p6);
        if (intersect == INTERSECT || intersect == SHAREFACE) {
          if (!b->quiet) {
            if (intersect == INTERSECT) {
              printf("  Facet #%d intersects facet #%d at triangles:\n",
                     shellmark(sface1), shellmark(sface2));
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                     pointmark(p1), pointmark(p2), pointmark(p3),
                     pointmark(p4), pointmark(p5), pointmark(p6));
            } else {
              printf("  Facet #%d duplicates facet #%d at triangle:\n",
                     shellmark(sface1), shellmark(sface2));
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                     pointmark(p1), pointmark(p2), pointmark(p3),
                     pointmark(p4), pointmark(p5), pointmark(p6));
            }
          }
          // Increase the number of intersecting pairs.
          (*internum)++; 
          // Infect these two faces (although they may already be infected).
          sinfect(sface1);
          sinfect(sface2);
        }
      }
    }
    // Don't forget to free all three arrays. No further partition.
    delete [] leftarray;
    delete [] rightarray;  
    delete [] subfacearray;
  }
}